

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_readpage(LispPTR *args)

{
  int iVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  DLword *__buf;
  int *piVar4;
  ssize_t x;
  bool bVar5;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  undefined1 local_d0 [8];
  stat sbuf;
  off_t offval;
  ssize_t count;
  int rval;
  int npage;
  int fd;
  char *bufp;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    if ((*args & 0xfff0000) == 0xe0000) {
      local_d4 = *args & 0xffff;
    }
    else {
      if ((*args & 0xfff0000) == 0xf0000) {
        local_d8 = *args | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(*args);
        local_d8 = *pLVar3;
      }
      local_d4 = local_d8;
    }
    if ((args[1] & 0xfff0000) == 0xe0000) {
      local_dc = args[1] & 0xffff;
    }
    else {
      if ((args[1] & 0xfff0000) == 0xf0000) {
        local_e0 = args[1] | 0xffff0000;
      }
      else {
        pLVar3 = NativeAligned4FromLAddr(args[1]);
        local_e0 = *pLVar3;
      }
      local_dc = local_e0;
    }
    __buf = NativeAligned2FromLAddr(args[2]);
    alarm(TIMEOUT_TIME);
    do {
      piVar4 = __errno_location();
      *piVar4 = 0;
      iVar1 = fstat(local_d4,(stat *)local_d0);
      bVar5 = false;
      if (iVar1 == -1) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    alarm(0);
    if (iVar1 == 0) {
      if (((uint)sbuf.st_nlink & 0xf000) == 0x8000) {
        do {
          alarm(TIMEOUT_TIME);
          do {
            piVar4 = __errno_location();
            *piVar4 = 0;
            sbuf.__glibc_reserved[2] = lseek(local_d4,(long)(int)(local_dc << 9),0);
            bVar5 = false;
            if (sbuf.__glibc_reserved[2] == -1) {
              piVar4 = __errno_location();
              bVar5 = *piVar4 == 4;
            }
          } while (bVar5);
          alarm(0);
          if (sbuf.__glibc_reserved[2] != -1) goto LAB_00133764;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        piVar4 = __errno_location();
        *Lisp_errno = *piVar4;
      }
      else {
LAB_00133764:
        do {
          alarm(TIMEOUT_TIME);
          do {
            piVar4 = __errno_location();
            *piVar4 = 0;
            x = read(local_d4,__buf,0x200);
            bVar5 = false;
            if (x == -1) {
              piVar4 = __errno_location();
              bVar5 = *piVar4 == 4;
            }
          } while (bVar5);
          alarm(0);
          if (x != -1) {
            memset((void *)((long)__buf + x),0,0x200 - x);
            word_swap_page(__buf,0x80);
            LVar2 = GetSmallp(x);
            return LVar2;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        piVar4 = __errno_location();
        *Lisp_errno = *piVar4;
      }
    }
    else {
      piVar4 = __errno_location();
      *Lisp_errno = *piVar4;
    }
  }
  else {
    *Lisp_errno = 100;
  }
  return 0;
}

Assistant:

LispPTR COM_readpage(LispPTR *args)
{
  char *bufp;
  int fd, npage, rval;
  ssize_t count;
  off_t offval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  fd = LispNumToCInt(args[0]);
  npage = LispNumToCInt(args[1]);
  bufp = (char *)NativeAligned2FromLAddr(args[2]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (S_ISREG(sbuf.st_mode)) {
  /*
   * The request file is a regular file.  We have to make sure that
   * next byte read is at the beginning of the requested page of the
   * file.  If the request file is special file, lseek is not needed.
   */
  sklp:
    TIMEOUT(offval = lseek(fd, (npage * FDEV_PAGE_SIZE), SEEK_SET));
    if (offval == -1) {
      if (errno == EINTR) goto sklp; /* interrupted, retry */
      *Lisp_errno = errno;
      return (NIL);
    }
  }

rdlp:
  TIMEOUT(count = read(fd, bufp, FDEV_PAGE_SIZE));
  if (count == -1) {
    if (errno == EINTR) goto rdlp; /* interrupted; retry */
    *Lisp_errno = errno;
    return (NIL);
  }

  /* O out the remaining part of the buffer. */
  memset(&bufp[count], 0, FDEV_PAGE_SIZE - count);

#ifdef BYTESWAP
  word_swap_page((DLword *)bufp, FDEV_PAGE_SIZE / 4);
#endif /* BYTESWAP */

  return (GetSmallp(count));
}